

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O0

UCollationResult __thiscall
icu_63::RuleBasedCollator::compare
          (RuleBasedCollator *this,UChar *left,int32_t leftLength,UChar *right,int32_t rightLength,
          UErrorCode *errorCode)

{
  UBool UVar1;
  UErrorCode *errorCode_local;
  int32_t rightLength_local;
  UChar *right_local;
  int32_t leftLength_local;
  UChar *left_local;
  RuleBasedCollator *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    if (((left == (UChar *)0x0) && (leftLength != 0)) ||
       ((right == (UChar *)0x0 && (rightLength != 0)))) {
      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
      this_local._4_4_ = UCOL_EQUAL;
    }
    else {
      errorCode_local._4_4_ = rightLength;
      right_local._4_4_ = leftLength;
      if (leftLength < 0) {
        if (-1 < rightLength) {
          right_local._4_4_ = u_strlen_63(left);
        }
      }
      else if (rightLength < 0) {
        errorCode_local._4_4_ = u_strlen_63(right);
      }
      this_local._4_4_ =
           doCompare(this,left,right_local._4_4_,right,errorCode_local._4_4_,errorCode);
    }
  }
  else {
    this_local._4_4_ = UCOL_EQUAL;
  }
  return this_local._4_4_;
}

Assistant:

UCollationResult
RuleBasedCollator::compare(const UChar *left, int32_t leftLength,
                           const UChar *right, int32_t rightLength,
                           UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode)) { return UCOL_EQUAL; }
    if((left == NULL && leftLength != 0) || (right == NULL && rightLength != 0)) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return UCOL_EQUAL;
    }
    // Make sure both or neither strings have a known length.
    // We do not optimize for mixed length/termination.
    if(leftLength >= 0) {
        if(rightLength < 0) { rightLength = u_strlen(right); }
    } else {
        if(rightLength >= 0) { leftLength = u_strlen(left); }
    }
    return doCompare(left, leftLength, right, rightLength, errorCode);
}